

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void __thiscall duckdb::Vector::Flatten(Vector *this,idx_t count)

{
  LogicalType *type;
  buffer_ptr<VectorBuffer> *this_00;
  ValidityMask *this_01;
  data_ptr_t pdVar1;
  PhysicalType PVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  pointer puVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  LogicalTypeId LVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  int64_t iVar20;
  unsigned_long count_00;
  VectorBuffer *pVVar21;
  type source_buffer;
  Vector *pVVar22;
  idx_t iVar23;
  pointer pVVar24;
  pointer pVVar25;
  type pVVar26;
  ulong uVar27;
  pointer pVVar28;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar29;
  data_ptr_t pdVar30;
  InternalException *pIVar31;
  idx_t i_1;
  idx_t elem_idx;
  idx_t idx;
  long *plVar32;
  long lVar33;
  pointer this_02;
  long lVar34;
  bool bVar35;
  idx_t count_local;
  Vector *local_120;
  int64_t sequence_count;
  templated_unique_single_t child_vec;
  int64_t increment;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  int64_t start;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_f0 [2];
  Vector other;
  LogicalType local_60;
  LogicalType local_48;
  
  count_local = count;
  switch(this->vector_type) {
  case FLAT_VECTOR:
    break;
  case FSST_VECTOR:
    iVar23 = FSSTVector::GetCount(this);
    LogicalType::LogicalType(&local_48,&this->type);
    Vector(&other,&local_48,iVar23);
    LogicalType::~LogicalType(&local_48);
    VectorOperations::Copy(this,&other,iVar23,0,0);
    Reference(this,&other);
    goto LAB_012a6032;
  case CONSTANT_VECTOR:
    puVar4 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar4 == (unsigned_long *)0x0) {
      bVar35 = false;
    }
    else {
      bVar35 = (*puVar4 & 1) == 0;
    }
    start = (int64_t)(this->buffer).internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    a_Stack_f0[0]._M_pi =
         (this->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    pVVar22 = (Vector *)this->data;
    type = &this->type;
    VectorBuffer::CreateStandardVector((LogicalType *)&other,(idx_t)type);
    this_00 = &this->buffer;
    local_120 = pVVar22;
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (this_00,(shared_ptr<duckdb::VectorBuffer,_true> *)&other);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&other.type);
    if (start != 0) {
      pVVar21 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
      source_buffer =
           shared_ptr<duckdb::VectorBuffer,_true>::operator*
                     ((shared_ptr<duckdb::VectorBuffer,_true> *)&start);
      VectorBuffer::MoveAuxiliaryData(pVVar21,source_buffer);
    }
    pVVar21 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(this_00);
    this_01 = &this->validity;
    this->data = (pVVar21->data).pointer;
    this->vector_type = FLAT_VECTOR;
    PVar2 = (this->type).physical_type_;
    if (bVar35) {
      if (PVar2 == ARRAY) {
switchD_012a6254_caseD_1d:
        pVVar22 = ArrayVector::GetEntryInternal<duckdb::Vector>(this);
        iVar23 = ArrayType::GetSize(type);
        make_uniq<duckdb::VectorArrayBuffer,duckdb::LogicalType_const&,unsigned_long&>
                  ((duckdb *)&sequence_count,type,&count_local);
        pVVar24 = unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                  ::operator->((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                                *)&sequence_count);
        local_120 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (&pVVar24->child);
        if (bVar35) {
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    (&this_01->super_TemplatedValidityMask<unsigned_long>,count_local);
          TemplatedValidityMask<unsigned_long>::SetAllInvalid
                    (&(local_120->validity).super_TemplatedValidityMask<unsigned_long>,
                     count_local * iVar23);
          Flatten(local_120,count_local * iVar23);
        }
        make_uniq<duckdb::Vector,duckdb::Vector&>((duckdb *)&child_vec,pVVar22);
        pVVar25 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                            (&child_vec);
        Flatten(pVVar25,count_local * iVar23);
        SelectionVector::SelectionVector((SelectionVector *)&other,count_local * iVar23);
        lVar34 = 0;
        lVar33 = 0;
        for (uVar27 = 0; uVar27 < count_local; uVar27 = uVar27 + 1) {
          for (idx = 0; iVar23 != idx; idx = idx + 1) {
            pVVar26 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                      operator*(&child_vec);
            bVar35 = FlatVector::IsNull(pVVar26,idx);
            if (bVar35) {
              FlatVector::SetNull(local_120,lVar34 + idx,true);
            }
            *(int *)(other._0_8_ + lVar33 + idx * 4) = (int)idx;
          }
          lVar33 = lVar33 + iVar23 * 4;
          lVar34 = lVar34 + iVar23;
        }
        pVVar26 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (&child_vec);
        VectorOperations::Copy(pVVar26,local_120,(SelectionVector *)&other,count_local * iVar23,0,0)
        ;
        iVar20 = sequence_count;
        sequence_count = 0;
        ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<duckdb::VectorArrayBuffer,void>
                  ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&increment,
                   (VectorArrayBuffer *)iVar20);
        shared_ptr<duckdb::VectorBuffer,_true>::operator=
                  (&this->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&increment);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&other.type.type_info_);
        ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                  (&child_vec.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
                  );
        plVar32 = (long *)sequence_count;
LAB_012a63c0:
        if (plVar32 != (long *)0x0) {
          (**(code **)(*plVar32 + 8))();
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::EnsureWritable
                  (&this_01->super_TemplatedValidityMask<unsigned_long>);
        TemplatedValidityMask<unsigned_long>::SetAllInvalid
                  (&this_01->super_TemplatedValidityMask<unsigned_long>,count_local);
        if ((this->type).physical_type_ == STRUCT) goto switchD_012a6254_caseD_18;
      }
    }
    else {
      switch(PVar2) {
      case BOOL:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar30[iVar23] = VVar3 & FSST_VECTOR;
        }
        break;
      case UINT8:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar30[iVar23] = VVar3;
        }
        break;
      case INT8:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar30[iVar23] = VVar3;
        }
        break;
      case UINT16:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          (pdVar30 + iVar23 * 2)[0] = VVar3;
          (pdVar30 + iVar23 * 2)[1] = uVar6;
        }
        break;
      case INT16:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          (pdVar30 + iVar23 * 2)[0] = VVar3;
          (pdVar30 + iVar23 * 2)[1] = uVar6;
        }
        break;
      case UINT32:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar1 = pdVar30 + iVar23 * 4;
          pdVar1[0] = VVar3;
          pdVar1[1] = uVar6;
          pdVar1[2] = uVar7;
          pdVar1[3] = uVar8;
        }
        break;
      case INT32:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar1 = pdVar30 + iVar23 * 4;
          pdVar1[0] = VVar3;
          pdVar1[1] = uVar6;
          pdVar1[2] = uVar7;
          pdVar1[3] = uVar8;
        }
        break;
      case UINT64:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        uVar9 = local_120->field_0x4;
        uVar10 = local_120->field_0x5;
        uVar11 = local_120->field_0x6;
        uVar12 = local_120->field_0x7;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar1 = pdVar30 + iVar23 * 8;
          pdVar1[0] = VVar3;
          pdVar1[1] = uVar6;
          pdVar1[2] = uVar7;
          pdVar1[3] = uVar8;
          pdVar1[4] = uVar9;
          pdVar1[5] = uVar10;
          pdVar1[6] = uVar11;
          pdVar1[7] = uVar12;
        }
        break;
      case INT64:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        uVar9 = local_120->field_0x4;
        uVar10 = local_120->field_0x5;
        uVar11 = local_120->field_0x6;
        uVar12 = local_120->field_0x7;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar1 = pdVar30 + iVar23 * 8;
          pdVar1[0] = VVar3;
          pdVar1[1] = uVar6;
          pdVar1[2] = uVar7;
          pdVar1[3] = uVar8;
          pdVar1[4] = uVar9;
          pdVar1[5] = uVar10;
          pdVar1[6] = uVar11;
          pdVar1[7] = uVar12;
        }
        break;
      case UINT64|UINT8:
      case DOUBLE|BOOL:
      case DOUBLE|UINT8:
      case DOUBLE|INT8:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x16:
      case STRUCT|BOOL:
      case STRUCT|UINT8:
      case STRUCT|INT8:
      case STRUCT|UINT16:
switchD_012a6254_caseD_a:
        pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&other,"Unimplemented type for VectorOperations::Flatten",
                   (allocator *)&increment);
        InternalException::InternalException(pIVar31,(string *)&other);
        __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar1 = pdVar30 + iVar23 * 4;
          pdVar1[0] = VVar3;
          pdVar1[1] = uVar6;
          pdVar1[2] = uVar7;
          pdVar1[3] = uVar8;
        }
        break;
      case DOUBLE:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        uVar9 = local_120->field_0x4;
        uVar10 = local_120->field_0x5;
        uVar11 = local_120->field_0x6;
        uVar12 = local_120->field_0x7;
        for (iVar23 = 0; count_local != iVar23; iVar23 = iVar23 + 1) {
          pdVar1 = pdVar30 + iVar23 * 8;
          pdVar1[0] = VVar3;
          pdVar1[1] = uVar6;
          pdVar1[2] = uVar7;
          pdVar1[3] = uVar8;
          pdVar1[4] = uVar9;
          pdVar1[5] = uVar10;
          pdVar1[6] = uVar11;
          pdVar1[7] = uVar12;
        }
        break;
      case INTERVAL:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        uVar9 = local_120->field_0x4;
        uVar10 = local_120->field_0x5;
        uVar11 = local_120->field_0x6;
        uVar12 = local_120->field_0x7;
        LVar13 = (local_120->type).id_;
        PVar2 = (local_120->type).physical_type_;
        uVar14 = (local_120->type).field_0x2;
        uVar15 = (local_120->type).field_0x3;
        uVar16 = (local_120->type).field_0x4;
        uVar17 = (local_120->type).field_0x5;
        uVar18 = (local_120->type).field_0x6;
        uVar19 = (local_120->type).field_0x7;
        iVar23 = count_local;
        while (bVar35 = iVar23 != 0, iVar23 = iVar23 - 1, bVar35) {
          pdVar30[0] = VVar3;
          pdVar30[1] = uVar6;
          pdVar30[2] = uVar7;
          pdVar30[3] = uVar8;
          pdVar30[4] = uVar9;
          pdVar30[5] = uVar10;
          pdVar30[6] = uVar11;
          pdVar30[7] = uVar12;
          pdVar30[8] = LVar13;
          pdVar30[9] = PVar2;
          pdVar30[10] = uVar14;
          pdVar30[0xb] = uVar15;
          pdVar30[0xc] = uVar16;
          pdVar30[0xd] = uVar17;
          pdVar30[0xe] = uVar18;
          pdVar30[0xf] = uVar19;
          pdVar30 = pdVar30 + 0x10;
        }
        break;
      case LIST:
        pdVar30 = this->data;
        VVar3 = local_120->vector_type;
        uVar6 = local_120->field_0x1;
        uVar7 = local_120->field_0x2;
        uVar8 = local_120->field_0x3;
        uVar9 = local_120->field_0x4;
        uVar10 = local_120->field_0x5;
        uVar11 = local_120->field_0x6;
        uVar12 = local_120->field_0x7;
        LVar13 = (local_120->type).id_;
        PVar2 = (local_120->type).physical_type_;
        uVar14 = (local_120->type).field_0x2;
        uVar15 = (local_120->type).field_0x3;
        uVar16 = (local_120->type).field_0x4;
        uVar17 = (local_120->type).field_0x5;
        uVar18 = (local_120->type).field_0x6;
        uVar19 = (local_120->type).field_0x7;
        iVar23 = count_local;
        while (bVar35 = iVar23 != 0, iVar23 = iVar23 - 1, bVar35) {
          pdVar30[0] = VVar3;
          pdVar30[1] = uVar6;
          pdVar30[2] = uVar7;
          pdVar30[3] = uVar8;
          pdVar30[4] = uVar9;
          pdVar30[5] = uVar10;
          pdVar30[6] = uVar11;
          pdVar30[7] = uVar12;
          pdVar30[8] = LVar13;
          pdVar30[9] = PVar2;
          pdVar30[10] = uVar14;
          pdVar30[0xb] = uVar15;
          pdVar30[0xc] = uVar16;
          pdVar30[0xd] = uVar17;
          pdVar30[0xe] = uVar18;
          pdVar30[0xf] = uVar19;
          pdVar30 = pdVar30 + 0x10;
        }
        break;
      case STRUCT:
switchD_012a6254_caseD_18:
        make_uniq<duckdb::VectorStructBuffer>();
        pVVar28 = unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                  ::operator->((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                                *)&increment);
        pvVar29 = StructVector::GetEntries(this);
        puVar5 = (pvVar29->
                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_02 = (pvVar29->
                       super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; iVar20 = increment,
            this_02 != puVar5; this_02 = this_02 + 1) {
          pVVar26 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                              (this_02);
          make_uniq<duckdb::Vector,duckdb::Vector&>((duckdb *)&other,pVVar26);
          pVVar25 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                *)&other);
          Flatten(pVVar25,count_local);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                      *)&pVVar28->children,
                     (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)&other
                    );
          ::std::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::~unique_ptr
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)&other);
        }
        increment = 0;
        ::std::__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<duckdb::VectorStructBuffer,void>
                  ((__shared_ptr<duckdb::VectorBuffer,(__gnu_cxx::_Lock_policy)2> *)&other,
                   (VectorStructBuffer *)iVar20);
        shared_ptr<duckdb::VectorBuffer,_true>::operator=
                  (&this->auxiliary,(shared_ptr<duckdb::VectorBuffer,_true> *)&other);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&other.type);
        plVar32 = (long *)increment;
        goto LAB_012a63c0;
      case ARRAY:
        goto switchD_012a6254_caseD_1d;
      default:
        if (PVar2 == VARCHAR) {
          VVar3 = local_120->vector_type;
          uVar6 = local_120->field_0x1;
          uVar7 = local_120->field_0x2;
          uVar8 = local_120->field_0x3;
          uVar9 = local_120->field_0x4;
          uVar10 = local_120->field_0x5;
          uVar11 = local_120->field_0x6;
          uVar12 = local_120->field_0x7;
          LVar13 = (local_120->type).id_;
          PVar2 = (local_120->type).physical_type_;
          uVar14 = (local_120->type).field_0x2;
          uVar15 = (local_120->type).field_0x3;
          uVar16 = (local_120->type).field_0x4;
          uVar17 = (local_120->type).field_0x5;
          uVar18 = (local_120->type).field_0x6;
          uVar19 = (local_120->type).field_0x7;
          pdVar30 = this->data + 8;
          iVar23 = count_local;
          while (bVar35 = iVar23 != 0, iVar23 = iVar23 - 1, bVar35) {
            pdVar30[-8] = VVar3;
            pdVar30[-7] = uVar6;
            pdVar30[-6] = uVar7;
            pdVar30[-5] = uVar8;
            pdVar30[-4] = uVar9;
            pdVar30[-3] = uVar10;
            pdVar30[-2] = uVar11;
            pdVar30[-1] = uVar12;
            pdVar30[0] = LVar13;
            pdVar30[1] = PVar2;
            pdVar30[2] = uVar14;
            pdVar30[3] = uVar15;
            pdVar30[4] = uVar16;
            pdVar30[5] = uVar17;
            pdVar30[6] = uVar18;
            pdVar30[7] = uVar19;
            pdVar30 = pdVar30 + 0x10;
          }
        }
        else if (PVar2 == UINT128) {
          pdVar30 = this->data;
          VVar3 = local_120->vector_type;
          uVar6 = local_120->field_0x1;
          uVar7 = local_120->field_0x2;
          uVar8 = local_120->field_0x3;
          uVar9 = local_120->field_0x4;
          uVar10 = local_120->field_0x5;
          uVar11 = local_120->field_0x6;
          uVar12 = local_120->field_0x7;
          LVar13 = (local_120->type).id_;
          PVar2 = (local_120->type).physical_type_;
          uVar14 = (local_120->type).field_0x2;
          uVar15 = (local_120->type).field_0x3;
          uVar16 = (local_120->type).field_0x4;
          uVar17 = (local_120->type).field_0x5;
          uVar18 = (local_120->type).field_0x6;
          uVar19 = (local_120->type).field_0x7;
          iVar23 = count_local;
          while (bVar35 = iVar23 != 0, iVar23 = iVar23 - 1, bVar35) {
            pdVar30[0] = VVar3;
            pdVar30[1] = uVar6;
            pdVar30[2] = uVar7;
            pdVar30[3] = uVar8;
            pdVar30[4] = uVar9;
            pdVar30[5] = uVar10;
            pdVar30[6] = uVar11;
            pdVar30[7] = uVar12;
            pdVar30[8] = LVar13;
            pdVar30[9] = PVar2;
            pdVar30[10] = uVar14;
            pdVar30[0xb] = uVar15;
            pdVar30[0xc] = uVar16;
            pdVar30[0xd] = uVar17;
            pdVar30[0xe] = uVar18;
            pdVar30[0xf] = uVar19;
            pdVar30 = pdVar30 + 0x10;
          }
        }
        else {
          if (PVar2 != INT128) goto switchD_012a6254_caseD_a;
          pdVar30 = this->data;
          VVar3 = local_120->vector_type;
          uVar6 = local_120->field_0x1;
          uVar7 = local_120->field_0x2;
          uVar8 = local_120->field_0x3;
          uVar9 = local_120->field_0x4;
          uVar10 = local_120->field_0x5;
          uVar11 = local_120->field_0x6;
          uVar12 = local_120->field_0x7;
          LVar13 = (local_120->type).id_;
          PVar2 = (local_120->type).physical_type_;
          uVar14 = (local_120->type).field_0x2;
          uVar15 = (local_120->type).field_0x3;
          uVar16 = (local_120->type).field_0x4;
          uVar17 = (local_120->type).field_0x5;
          uVar18 = (local_120->type).field_0x6;
          uVar19 = (local_120->type).field_0x7;
          iVar23 = count_local;
          while (bVar35 = iVar23 != 0, iVar23 = iVar23 - 1, bVar35) {
            pdVar30[0] = VVar3;
            pdVar30[1] = uVar6;
            pdVar30[2] = uVar7;
            pdVar30[3] = uVar8;
            pdVar30[4] = uVar9;
            pdVar30[5] = uVar10;
            pdVar30[6] = uVar11;
            pdVar30[7] = uVar12;
            pdVar30[8] = LVar13;
            pdVar30[9] = PVar2;
            pdVar30[10] = uVar14;
            pdVar30[0xb] = uVar15;
            pdVar30[0xc] = uVar16;
            pdVar30[0xd] = uVar17;
            pdVar30[0xe] = uVar18;
            pdVar30[0xf] = uVar19;
            pdVar30 = pdVar30 + 0x10;
          }
        }
      }
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_f0);
    break;
  case DICTIONARY_VECTOR:
    LogicalType::LogicalType(&local_60,&this->type);
    Vector(&other,&local_60,count_local);
    LogicalType::~LogicalType(&local_60);
    VectorOperations::Copy(this,&other,count_local,0,0);
    Reference(this,&other);
LAB_012a6032:
    ~Vector(&other);
    break;
  case SEQUENCE_VECTOR:
    SequenceVector::GetSequence(this,&start,&increment,&sequence_count);
    count_00 = NumericCastImpl<unsigned_long,_long,_false>::Convert(sequence_count);
    VectorBuffer::CreateStandardVector((LogicalType *)&other,(idx_t)&this->type);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (&this->buffer,(shared_ptr<duckdb::VectorBuffer,_true> *)&other);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&other.type);
    pVVar21 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
    this->data = (pVVar21->data).pointer;
    VectorOperations::GenerateSequence(this,count_00,start,increment);
    break;
  default:
    pIVar31 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&other,"Unimplemented type for normalify",(allocator *)&start);
    InternalException::InternalException(pIVar31,(string *)&other);
    __cxa_throw(pIVar31,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Vector::Flatten(idx_t count) {
	switch (GetVectorType()) {
	case VectorType::FLAT_VECTOR:
		// already a flat vector
		break;
	case VectorType::FSST_VECTOR: {
		// Even though count may only be a part of the vector, we need to flatten the whole thing due to the way
		// ToUnifiedFormat uses flatten
		idx_t total_count = FSSTVector::GetCount(*this);
		// create vector to decompress into
		Vector other(GetType(), total_count);
		// now copy the data of this vector to the other vector, decompressing the strings in the process
		VectorOperations::Copy(*this, other, total_count, 0, 0);
		// create a reference to the data in the other vector
		this->Reference(other);
		break;
	}
	case VectorType::DICTIONARY_VECTOR: {
		// create a new flat vector of this type
		Vector other(GetType(), count);
		// now copy the data of this vector to the other vector, removing the selection vector in the process
		VectorOperations::Copy(*this, other, count, 0, 0);
		// create a reference to the data in the other vector
		this->Reference(other);
		break;
	}
	case VectorType::CONSTANT_VECTOR: {
		bool is_null = ConstantVector::IsNull(*this);
		// allocate a new buffer for the vector
		auto old_buffer = std::move(buffer);
		auto old_data = data;
		buffer = VectorBuffer::CreateStandardVector(type, MaxValue<idx_t>(STANDARD_VECTOR_SIZE, count));
		if (old_buffer) {
			D_ASSERT(buffer->GetAuxiliaryData() == nullptr);
			// The old buffer might be relying on the auxiliary data, keep it alive
			buffer->MoveAuxiliaryData(*old_buffer);
		}
		data = buffer->GetData();
		vector_type = VectorType::FLAT_VECTOR;
		if (is_null && GetType().InternalType() != PhysicalType::ARRAY) {
			// constant NULL, set nullmask
			validity.EnsureWritable();
			validity.SetAllInvalid(count);
			if (GetType().InternalType() != PhysicalType::STRUCT) {
				// for structs we still need to flatten the child vectors as well
				return;
			}
		}
		// non-null constant: have to repeat the constant
		switch (GetType().InternalType()) {
		case PhysicalType::BOOL:
			TemplatedFlattenConstantVector<bool>(data, old_data, count);
			break;
		case PhysicalType::INT8:
			TemplatedFlattenConstantVector<int8_t>(data, old_data, count);
			break;
		case PhysicalType::INT16:
			TemplatedFlattenConstantVector<int16_t>(data, old_data, count);
			break;
		case PhysicalType::INT32:
			TemplatedFlattenConstantVector<int32_t>(data, old_data, count);
			break;
		case PhysicalType::INT64:
			TemplatedFlattenConstantVector<int64_t>(data, old_data, count);
			break;
		case PhysicalType::UINT8:
			TemplatedFlattenConstantVector<uint8_t>(data, old_data, count);
			break;
		case PhysicalType::UINT16:
			TemplatedFlattenConstantVector<uint16_t>(data, old_data, count);
			break;
		case PhysicalType::UINT32:
			TemplatedFlattenConstantVector<uint32_t>(data, old_data, count);
			break;
		case PhysicalType::UINT64:
			TemplatedFlattenConstantVector<uint64_t>(data, old_data, count);
			break;
		case PhysicalType::INT128:
			TemplatedFlattenConstantVector<hugeint_t>(data, old_data, count);
			break;
		case PhysicalType::UINT128:
			TemplatedFlattenConstantVector<uhugeint_t>(data, old_data, count);
			break;
		case PhysicalType::FLOAT:
			TemplatedFlattenConstantVector<float>(data, old_data, count);
			break;
		case PhysicalType::DOUBLE:
			TemplatedFlattenConstantVector<double>(data, old_data, count);
			break;
		case PhysicalType::INTERVAL:
			TemplatedFlattenConstantVector<interval_t>(data, old_data, count);
			break;
		case PhysicalType::VARCHAR:
			TemplatedFlattenConstantVector<string_t>(data, old_data, count);
			break;
		case PhysicalType::LIST: {
			TemplatedFlattenConstantVector<list_entry_t>(data, old_data, count);
			break;
		}
		case PhysicalType::ARRAY: {
			auto &original_child = ArrayVector::GetEntry(*this);
			auto array_size = ArrayType::GetSize(GetType());
			auto flattened_buffer = make_uniq<VectorArrayBuffer>(GetType(), count);
			auto &new_child = flattened_buffer->GetChild();

			// Fast path: The array is a constant null
			if (is_null) {
				// Invalidate the parent array
				validity.SetAllInvalid(count);
				// Also invalidate the new child array
				new_child.validity.SetAllInvalid(count * array_size);
				// Recurse
				new_child.Flatten(count * array_size);
				// TODO: the fast path should exit here, but the part below it is somehow required for correctness
				// Attach the flattened buffer and return
				// auxiliary = shared_ptr<VectorBuffer>(flattened_buffer.release());
				// return;
			}

			// Now we need to "unpack" the child vector.
			// Basically, do this:
			//
			// | a1 | | 1 |      | a1 | | 1 |
			//        | 2 |      | a2 | | 2 |
			//	             =>    ..   | 1 |
			//                          | 2 |
			// 							 ...

			auto child_vec = make_uniq<Vector>(original_child);
			child_vec->Flatten(count * array_size);

			// Create a selection vector
			SelectionVector sel(count * array_size);
			for (idx_t array_idx = 0; array_idx < count; array_idx++) {
				for (idx_t elem_idx = 0; elem_idx < array_size; elem_idx++) {
					auto position = array_idx * array_size + elem_idx;
					// Broadcast the validity
					if (FlatVector::IsNull(*child_vec, elem_idx)) {
						FlatVector::SetNull(new_child, position, true);
					}
					sel.set_index(position, elem_idx);
				}
			}

			// Copy over the data to the new buffer
			VectorOperations::Copy(*child_vec, new_child, sel, count * array_size, 0, 0);
			auxiliary = shared_ptr<VectorBuffer>(flattened_buffer.release());

			break;
		}
		case PhysicalType::STRUCT: {
			auto normalified_buffer = make_uniq<VectorStructBuffer>();

			auto &new_children = normalified_buffer->GetChildren();

			auto &child_entries = StructVector::GetEntries(*this);
			for (auto &child : child_entries) {
				D_ASSERT(child->GetVectorType() == VectorType::CONSTANT_VECTOR);
				auto vector = make_uniq<Vector>(*child);
				vector->Flatten(count);
				new_children.push_back(std::move(vector));
			}
			auxiliary = shared_ptr<VectorBuffer>(normalified_buffer.release());
			break;
		}
		default:
			throw InternalException("Unimplemented type for VectorOperations::Flatten");
		}
		break;
	}
	case VectorType::SEQUENCE_VECTOR: {
		int64_t start, increment, sequence_count;
		SequenceVector::GetSequence(*this, start, increment, sequence_count);
		auto seq_count = NumericCast<idx_t>(sequence_count);

		buffer = VectorBuffer::CreateStandardVector(GetType(), MaxValue<idx_t>(STANDARD_VECTOR_SIZE, seq_count));
		data = buffer->GetData();
		VectorOperations::GenerateSequence(*this, seq_count, start, increment);
		break;
	}
	default:
		throw InternalException("Unimplemented type for normalify");
	}
}